

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

void __thiscall
lr_grammar::GrammarLR::calculate_expression_first
          (GrammarLR *this,int elemIndex,int expressionIndex,
          vector<int,_std::allocator<int>_> *result,bool choose)

{
  pointer piVar1;
  long lVar2;
  pointer pEVar3;
  pointer pvVar4;
  iterator iVar5;
  bool bVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  Express *this_00;
  uint uVar11;
  ulong uVar12;
  int index;
  ulong uVar13;
  vector<int,_std::allocator<int>_> notNULL;
  vector<int,_std::allocator<int>_> tmpF;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  lVar7 = (long)elemIndex;
  lVar9 = (long)expressionIndex;
  lVar2 = *(long *)&(this->elements).
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar7].expression_of_set.
                    super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                    ._M_impl.super__Vector_impl_data;
  if (*(long *)(lVar2 + 8 + lVar9 * 0x18) != *(long *)(lVar2 + lVar9 * 0x18)) {
    this_00 = (Express *)(lVar2 + lVar9 * 0x18);
    uVar13 = 0;
    local_50 = lVar7 * 0x18;
    lVar2 = lVar9 * 0x18;
    local_7c = expressionIndex;
    local_58 = result;
    do {
      index = (int)uVar13;
      piVar8 = base_grammar::Express::operator[](this_00,index);
      if (*piVar8 == elemIndex) {
        bVar6 = public_tool::is_in_vector
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(((this->first).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_50),-1);
        if (!bVar6) {
          if (!choose) {
            return;
          }
          iVar5._M_current =
               (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current !=
              (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar5._M_current = expressionIndex;
            (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            return;
          }
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->first_temp,iVar5,&local_7c);
          return;
        }
      }
      else {
        piVar8 = base_grammar::Express::operator[]
                           ((Express *)
                            (*(long *)&(this->elements).
                                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                       expression_of_set.
                                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                       ._M_impl.super__Vector_impl_data + lVar2),index);
        bVar6 = get_first(this,*piVar8);
        if (!bVar6) {
          bVar6 = public_tool::is_in_vector(result,-1);
          if (bVar6) {
            return;
          }
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          iVar5._M_current =
               (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current !=
              (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar5._M_current = -1;
            (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar5._M_current + 1;
            return;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (result,iVar5,(int *)&local_78);
          return;
        }
        pEVar3 = (this->elements).
                 super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = *(long *)&pEVar3[lVar7].expression_of_set.
                           super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                           ._M_impl.super__Vector_impl_data;
        if ((*(long *)(lVar10 + 8 + lVar9 * 0x18) - *(long *)(lVar10 + lVar9 * 0x18) >> 2) - 1U ==
            uVar13) {
          piVar8 = base_grammar::Express::operator[]((Express *)(lVar10 + lVar9 * 0x18),index);
          public_tool::connect_vector
                    (result,(this->first).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + *piVar8);
        }
        else {
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          piVar8 = base_grammar::Express::operator[]
                             ((Express *)
                              (*(long *)&pEVar3[lVar7].expression_of_set.
                                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                         ._M_impl.super__Vector_impl_data + lVar2),index);
          pvVar4 = (this->first).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar1 = *(pointer *)
                    ((long)&pvVar4[*piVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          lVar10 = *(long *)&pvVar4[*piVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
          piVar8 = base_grammar::Express::operator[]
                             ((Express *)
                              (*(long *)&(this->elements).
                                         super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                         expression_of_set.
                                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                         ._M_impl.super__Vector_impl_data + lVar2),index);
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_48,
                     (this->first).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + *piVar8);
          uVar11 = (uint)((ulong)((long)piVar1 - lVar10) >> 2);
          if (0 < (int)uVar11) {
            uVar12 = (ulong)(uVar11 & 0x7fffffff);
            lVar10 = 0;
            do {
              if (*(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar10) != -1) {
                if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_78,
                             (iterator)
                             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             (int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar10));
                }
                else {
                  *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish =
                       *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + lVar10);
                  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              lVar10 = lVar10 + 4;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          result = local_58;
          public_tool::connect_vector(local_58,&local_78);
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        piVar8 = base_grammar::Express::operator[]
                           ((Express *)
                            (*(long *)&(this->elements).
                                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                       expression_of_set.
                                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                       ._M_impl.super__Vector_impl_data + lVar2),index);
        bVar6 = public_tool::is_in_vector
                          ((this->first).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *piVar8,-1);
        if (!bVar6) {
          return;
        }
      }
      uVar13 = uVar13 + 1;
      this_00 = (Express *)
                (*(long *)&(this->elements).
                           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar7].expression_of_set.
                           super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                           ._M_impl.super__Vector_impl_data + lVar9 * 0x18);
    } while (uVar13 < (ulong)((long)(this_00->expression).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this_00->expression).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void  GrammarLR::calculate_expression_first(int elemIndex, int expressionIndex, vector<int>& result, bool choose){

    result.clear();
    //vector<int>::iterator it =elements[elemIndex].expression_of_set[expressionIndex].expression.begin() ;
    //vector<int>::iterator end = elements[elemIndex].expression_of_set[expressionIndex].expression.end();




    for (int i = 0; i < elements[elemIndex].expression_of_set[expressionIndex].expression.size(); i++){

        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        if (elements[elemIndex].expression_of_set[expressionIndex][i] == elemIndex) {

            //后续处理
            if (public_tool::is_in_vector(first[elemIndex], -1)) continue;
            else{
                if (choose) this->first_temp.push_back(expressionIndex);
                break;
            }

        }

        if (get_first(elements[elemIndex].expression_of_set[expressionIndex][i])){

            if (i == elements[elemIndex].expression_of_set[expressionIndex].expression.size() - 1){
                public_tool::connect_vector(result, first[elements[elemIndex].expression_of_set[expressionIndex][i]]);
            }
            else
            {
                vector<int> notNULL;//将空串除去
                int length = first[elements[elemIndex].expression_of_set[expressionIndex][i]].size();
                vector<int> tmpF = first[elements[elemIndex].expression_of_set[expressionIndex][i]];
                for (int j = 0; j < length; j++){
                    if (tmpF[j] != -1){
                        notNULL.push_back(tmpF[j]);
                    }
                }
                public_tool::connect_vector(result, notNULL);
            }

        }
        else
        {
            if (!public_tool::is_in_vector(result, -1)) result.push_back(-1);
            break;
        }

        //-1不在这个式子里面后面不用继续了
        if (!public_tool::is_in_vector(first[elements[elemIndex].expression_of_set[expressionIndex][i]], -1)) break;

    }
}